

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_replace(HSQUIRRELVM v)

{
  SQArray *this;
  SQObjectPtr *pSVar1;
  SQRESULT SVar2;
  EVP_PKEY_CTX *src;
  
  pSVar1 = stack_get(v,1);
  if (((pSVar1->super_SQObject)._flags & 1) == 0) {
    pSVar1 = stack_get(v,1);
    this = (pSVar1->super_SQObject)._unVal.pArray;
    pSVar1 = stack_get(v,2);
    sqvector<SQObjectPtr,_unsigned_int>::copy
              (&this->_values,
               (EVP_PKEY_CTX *)
               &(((pSVar1->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate,src);
    SQArray::ShrinkIfNeeded(this);
    SQVM::Pop(v,1);
    return 1;
  }
  SVar2 = sq_throwerror(v,"Cannot modify immutable object");
  return SVar2;
}

Assistant:

static SQInteger array_replace(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *dst = _array(stack_get(v, 1));
    SQArray *src = _array(stack_get(v, 2));
    dst->_values.copy(src->_values);
    dst->ShrinkIfNeeded();
    VT_CLONE_FROM_TO(src, dst);
    v->Pop(1);
    return 1;
}